

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall slang::ast::TypeArgFormatter::startMessage(TypeArgFormatter *this,Diagnostic *diag)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  char *pcVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  pointer pvVar5;
  Type *pTVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t *psVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  ulong *puVar14;
  uint64_t hash;
  value_type *elements;
  pointer pvVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  basic_string_view<char,_std::char_traits<char>_> *pbVar22;
  uchar uVar23;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  undefined1 auVar24 [16];
  char cVar28;
  char cVar31;
  char cVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  try_emplace_args_t local_189;
  basic_string_view<char,_std::char_traits<char>_> *local_188;
  Type *local_180;
  basic_string_view<char,_std::char_traits<char>_> *local_178;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
  *local_170;
  TypeArgFormatter *local_168;
  locator res;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
  typeNames;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)&this->seenTypes);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)&this->typesToDisambiguate);
  typeNames.super_Storage.ptr = (char *)&typeNames;
  typeNames._112_8_ = 0x3f;
  typeNames._120_8_ = 1;
  typeNames._128_16_ = ZEXT816(0x509420);
  typeNames._144_16_ = (undefined1  [16])0x0;
  pvVar15 = (diag->args).
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (diag->args).
           super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_170 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
               *)&this->typesToDisambiguate;
  typeNames.super_Storage._104_8_ = typeNames.super_Storage.ptr;
  if (pvVar15 == pvVar5) {
    return;
  }
LAB_004cc783:
  if ((((pvVar15 != (pointer)0x0) &&
       ((pvVar15->
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        ).
        super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        ._M_index == '\x05')) &&
      (puVar14 = (ulong *)std::__any_caster<slang::ast::Type_const*>
                                    ((any *)((long)&(pvVar15->
                                                                                                        
                                                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  ).
                                                  super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  ._M_u + 8)), puVar14 != (ulong *)0x0)) &&
     (pTVar6 = (Type *)*puVar14, (pTVar6->super_Symbol).kind == TypeAlias)) {
    local_188 = &(pTVar6->super_Symbol).name;
    local_180 = pTVar6;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &typeNames.super_Storage.field_0x68,local_188);
    uVar19 = hash >> (typeNames._112_1_ & 0x3f);
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar16 = 0;
    uVar18 = uVar19;
    do {
      pbVar1 = local_188;
      pcVar2 = (char *)(typeNames._128_8_ + uVar18 * 0x10);
      bVar12 = pcVar2[0xf];
      cVar28 = (char)uVar4;
      auVar24[0] = -(*pcVar2 == cVar28);
      cVar31 = (char)((uint)uVar4 >> 8);
      auVar24[1] = -(pcVar2[1] == cVar31);
      cVar32 = (char)((uint)uVar4 >> 0x10);
      auVar24[2] = -(pcVar2[2] == cVar32);
      bVar27 = (byte)((uint)uVar4 >> 0x18);
      auVar24[3] = -(pcVar2[3] == bVar27);
      auVar24[4] = -(pcVar2[4] == cVar28);
      auVar24[5] = -(pcVar2[5] == cVar31);
      auVar24[6] = -(pcVar2[6] == cVar32);
      auVar24[7] = -(pcVar2[7] == bVar27);
      auVar24[8] = -(pcVar2[8] == cVar28);
      auVar24[9] = -(pcVar2[9] == cVar31);
      auVar24[10] = -(pcVar2[10] == cVar32);
      auVar24[0xb] = -(pcVar2[0xb] == bVar27);
      auVar24[0xc] = -(pcVar2[0xc] == cVar28);
      auVar24[0xd] = -(pcVar2[0xd] == cVar31);
      auVar24[0xe] = -(pcVar2[0xe] == cVar32);
      auVar24[0xf] = -(bVar12 == bVar27);
      uVar13 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
      if (uVar13 != 0) {
        lVar20 = typeNames._128_8_ + uVar18 * 0x10;
        lVar17 = typeNames._136_8_ + uVar18 * 0x168;
        local_168 = this;
        do {
          uVar7 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          local_178 = (basic_string_view<char,_std::char_traits<char>_> *)
                      (lVar17 + (ulong)uVar7 * 0x18);
          bVar11 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &typeNames.super_Storage.field_0x68,pbVar1,local_178);
          this = local_168;
          if (bVar11) {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = pTVar6;
            uVar19 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar16 = uVar19 >> ((byte)(local_168->typesToDisambiguate).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar4 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar19 & 0xff];
            local_188 = (basic_string_view<char,_std::char_traits<char>_> *)
                        (local_168->typesToDisambiguate).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                        .arrays.groups_size_mask;
            uVar21 = 0;
            uVar18 = uVar16;
            goto LAB_004cc9c2;
          }
          uVar13 = uVar13 - 1 & uVar13;
        } while (uVar13 != 0);
        bVar12 = *(byte *)(lVar20 + 0xf);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar12) == 0) break;
      lVar17 = uVar18 + uVar16;
      uVar16 = uVar16 + 1;
      uVar18 = lVar17 + 1U & typeNames._120_8_;
    } while (uVar16 <= (ulong)typeNames._120_8_);
    if ((ulong)typeNames._152_8_ < (ulong)typeNames._144_8_) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                       *)&typeNames.super_Storage.field_0x68,(arrays_type *)&typeNames.field_0x70,
                 uVar19,hash,&local_189,local_188,&local_180);
      typeNames._152_8_ = typeNames._152_8_ + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                       *)&typeNames.super_Storage.field_0x68,hash,&local_189,local_188,&local_180);
    }
  }
  goto LAB_004cc7a6;
  while( true ) {
    lVar17 = uVar18 + uVar21;
    uVar21 = uVar21 + 1;
    uVar18 = lVar17 + 1U & (ulong)local_188;
    if (local_188 < uVar21) break;
LAB_004cc9c2:
    pgVar3 = (local_168->typesToDisambiguate).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
             .arrays.groups_ + uVar18;
    bVar12 = pgVar3->m[0xf].n;
    uVar23 = (uchar)uVar4;
    auVar29[0] = -(pgVar3->m[0].n == uVar23);
    uVar25 = (uchar)((uint)uVar4 >> 8);
    auVar29[1] = -(pgVar3->m[1].n == uVar25);
    uVar26 = (uchar)((uint)uVar4 >> 0x10);
    auVar29[2] = -(pgVar3->m[2].n == uVar26);
    bVar27 = (byte)((uint)uVar4 >> 0x18);
    auVar29[3] = -(pgVar3->m[3].n == bVar27);
    auVar29[4] = -(pgVar3->m[4].n == uVar23);
    auVar29[5] = -(pgVar3->m[5].n == uVar25);
    auVar29[6] = -(pgVar3->m[6].n == uVar26);
    auVar29[7] = -(pgVar3->m[7].n == bVar27);
    auVar29[8] = -(pgVar3->m[8].n == uVar23);
    auVar29[9] = -(pgVar3->m[9].n == uVar25);
    auVar29[10] = -(pgVar3->m[10].n == uVar26);
    auVar29[0xb] = -(pgVar3->m[0xb].n == bVar27);
    auVar29[0xc] = -(pgVar3->m[0xc].n == uVar23);
    auVar29[0xd] = -(pgVar3->m[0xd].n == uVar25);
    auVar29[0xe] = -(pgVar3->m[0xe].n == uVar26);
    auVar29[0xf] = -(bVar12 == bVar27);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      uVar7 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      local_180 = pTVar6;
      if (pTVar6 == (local_168->typesToDisambiguate).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                    .arrays.elements_[uVar18 * 0xf + (ulong)uVar7]) goto LAB_004cca67;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar12) == 0) break;
  }
  if ((local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.size <
      (local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.ml) {
    local_180 = pTVar6;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::nosize_unchecked_emplace_at<slang::ast::Type_const*>
              ((locator *)&res,local_170,(arrays_type *)local_170,uVar16,uVar19,&local_180);
    psVar10 = &(this->typesToDisambiguate).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
               .size_ctrl.size;
    *psVar10 = *psVar10 + 1;
  }
  else {
    local_180 = pTVar6;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
              ((locator *)&res,local_170,uVar19,&local_180);
  }
LAB_004cca67:
  pbVar1 = local_178 + 1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (Type *)pbVar1->_M_len;
  uVar19 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar16 = uVar19 >> ((byte)(this->typesToDisambiguate).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                            .arrays.groups_size_index & 0x3f);
  local_178 = local_178 + 1;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar19 & 0xff];
  local_188 = (basic_string_view<char,_std::char_traits<char>_> *)
              (this->typesToDisambiguate).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
              .arrays.groups_size_mask;
  pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  uVar18 = uVar16;
  do {
    pgVar3 = (this->typesToDisambiguate).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
             .arrays.groups_ + uVar18;
    bVar12 = pgVar3->m[0xf].n;
    uVar23 = (uchar)uVar4;
    auVar30[0] = -(pgVar3->m[0].n == uVar23);
    uVar25 = (uchar)((uint)uVar4 >> 8);
    auVar30[1] = -(pgVar3->m[1].n == uVar25);
    uVar26 = (uchar)((uint)uVar4 >> 0x10);
    auVar30[2] = -(pgVar3->m[2].n == uVar26);
    bVar27 = (byte)((uint)uVar4 >> 0x18);
    auVar30[3] = -(pgVar3->m[3].n == bVar27);
    auVar30[4] = -(pgVar3->m[4].n == uVar23);
    auVar30[5] = -(pgVar3->m[5].n == uVar25);
    auVar30[6] = -(pgVar3->m[6].n == uVar26);
    auVar30[7] = -(pgVar3->m[7].n == bVar27);
    auVar30[8] = -(pgVar3->m[8].n == uVar23);
    auVar30[9] = -(pgVar3->m[9].n == uVar25);
    auVar30[10] = -(pgVar3->m[10].n == uVar26);
    auVar30[0xb] = -(pgVar3->m[0xb].n == bVar27);
    auVar30[0xc] = -(pgVar3->m[0xc].n == uVar23);
    auVar30[0xd] = -(pgVar3->m[0xd].n == uVar25);
    auVar30[0xe] = -(pgVar3->m[0xe].n == uVar26);
    auVar30[0xf] = -(bVar12 == bVar27);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      uVar7 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      if ((Type *)pbVar1->_M_len ==
          (this->typesToDisambiguate).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
          .arrays.elements_[uVar18 * 0xf + (ulong)uVar7]) goto LAB_004cc7a6;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar12) == 0) break;
    psVar10 = &pbVar22->_M_len;
    pbVar22 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar22->_M_len + 1);
    uVar18 = (long)psVar10 + uVar18 + 1 & (ulong)local_188;
  } while (pbVar22 <= local_188);
  if ((this->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.size <
      (this->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::nosize_unchecked_emplace_at<slang::ast::Type_const*const&>
              ((locator *)&res,local_170,(arrays_type *)local_170,uVar16,uVar19,(Type **)local_178);
    psVar10 = &(this->typesToDisambiguate).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
               .size_ctrl.size;
    *psVar10 = *psVar10 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_with_rehash<slang::ast::Type_const*const&>
              ((locator *)&res,local_170,uVar19,(Type **)local_178);
  }
LAB_004cc7a6:
  pvVar15 = pvVar15 + 1;
  if (pvVar15 == pvVar5) {
    res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
             typeNames.super_Storage._104_8_;
    if (typeNames._136_8_ == 0) {
      return;
    }
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>
                  *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
                          *)typeNames._136_8_,(typeNames._120_8_ * 0x178 + 0x186U) / 0x18);
    return;
  }
  goto LAB_004cc783;
}

Assistant:

void TypeArgFormatter::startMessage(const Diagnostic& diag) {
    seenTypes.clear();
    typesToDisambiguate.clear();

    SmallMap<std::string_view, const Type*, 4> typeNames;
    for (auto& arg : diag.args) {
        if (auto customArg = std::get_if<Diagnostic::CustomArgType>(&arg)) {
            if (auto typePtr = std::any_cast<const Type*>(&customArg->second)) {
                auto& type = **typePtr;
                if (type.isAlias()) {
                    auto [it, inserted] = typeNames.emplace(type.name, &type);
                    if (!inserted) {
                        typesToDisambiguate.insert(&type);
                        typesToDisambiguate.insert(it->second);
                    }
                }
            }
        }
    }
}